

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O3

FTextureFormat __thiscall FDDSTexture::GetFormat(FDDSTexture *this)

{
  return TEX_RGB;
}

Assistant:

FTextureFormat FDDSTexture::GetFormat()
{
#if 0
	switch (Format)
	{
	case ID_DXT1:	return TEX_DXT1;
	case ID_DXT2:	return TEX_DXT2;
	case ID_DXT3:	return TEX_DXT3;
	case ID_DXT4:	return TEX_DXT4;
	case ID_DXT5:	return TEX_DXT5;
	default:		return TEX_RGB;
	}
#else
	// For now, create a true color texture to preserve all colors.
	return TEX_RGB;
#endif
}